

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::SendRTPRTCPData(RTPTCPTransmitter *this,void *data,size_t len)

{
  bool bVar1;
  pointer ppVar2;
  ssize_t sVar3;
  size_type sVar4;
  uint *puVar5;
  ulong local_78;
  size_t i;
  int local_5c;
  undefined1 local_56;
  undefined1 local_55;
  SocketType sock;
  undefined1 local_50 [2];
  uint8_t lengthBytes [2];
  int flags;
  vector<int,_std::allocator<int>_> errSockets;
  iterator end;
  iterator it;
  size_t len_local;
  void *data_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else if (len < 0x10000) {
    end = std::
          map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
          ::begin(&this->m_destSockets);
    errSockets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                  ::end(&this->m_destSockets);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
    sock = 0x4000;
    while (bVar1 = std::operator!=(&end,(_Self *)&errSockets.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          , bVar1) {
      it._M_node._1_1_ = (undefined1)(len >> 8);
      local_56 = it._M_node._1_1_;
      it._M_node._0_1_ = (undefined1)len;
      local_55 = it._M_node._0_1_;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>
               ::operator->(&end);
      local_5c = ppVar2->first;
      sVar3 = send(local_5c,&local_56,2,sock);
      if ((sVar3 < 0) || (sVar3 = send(local_5c,data,len,sock), sVar3 < 0)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_50,&local_5c);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>::
      operator++(&end);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_50);
    if (sVar4 != 0) {
      for (local_78 = 0;
          sVar4 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), local_78 < sVar4;
          local_78 = local_78 + 1) {
        puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)local_50,local_78);
        (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[0x20])
                  (this,(ulong)*puVar5);
      }
    }
    this_local._4_4_ = 0;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  }
  else {
    this_local._4_4_ = -0xc0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::SendRTPRTCPData(const void *data, size_t len)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (len > RTPTCPTRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SPECIFIEDSIZETOOBIG;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();

	vector<SocketType> errSockets;
	int flags = 0;
#ifdef RTP_HAVE_MSG_NOSIGNAL
	flags = MSG_NOSIGNAL;
#endif // RTP_HAVE_MSG_NOSIGNAL

	while (it != end)
	{
		uint8_t lengthBytes[2] = { (uint8_t)((len >> 8)&0xff), (uint8_t)(len&0xff) };
		SocketType sock = it->first;

		if (send(sock,(const char *)lengthBytes,2,flags) < 0 ||
			send(sock,(const char *)data,len,flags) < 0)
			errSockets.push_back(sock);
		++it;
	}
	
	MAINMUTEX_UNLOCK

	if (errSockets.size() != 0)
	{
		for (size_t i = 0 ; i < errSockets.size() ; i++)
			OnSendError(errSockets[i]);
	}

	// Don't return an error code to avoid the poll thread exiting
	// due to one closed connection for example

	return 0;
}